

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

Type __thiscall wasm::DataFlow::Node::getWasmType(Node *this)

{
  pointer ppNVar1;
  ulong uVar2;
  undefined8 uVar3;
  
  do {
    switch(this->type) {
    case Var:
      return (Type)(uintptr_t)(this->field_1).expr;
    case Expr:
      return (Type)(((this->field_1).expr)->type).id;
    case Phi:
      ppNVar1 = (this->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(this->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3;
      if (uVar2 < 2) {
        uVar3 = 1;
LAB_00835c62:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                   ,uVar2);
      }
      this = ppNVar1[1];
      break;
    default:
      handle_unreachable("invalid node type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/node.h"
                         ,0xa6);
    case Zext:
      ppNVar1 = (this->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->values).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish == ppNVar1) {
        uVar3 = 0;
        uVar2 = 0;
        goto LAB_00835c62;
      }
      this = *ppNVar1;
      break;
    case Bad:
      return (Type)1;
    }
  } while( true );
}

Assistant:

wasm::Type getWasmType() {
    switch (type) {
      case Var:
        return wasmType;
      case Expr:
        return expr->type;
      case Phi:
        return getValue(1)->getWasmType();
      case Zext:
        return getValue(0)->getWasmType();
      case Bad:
        return wasm::Type::unreachable;
      default:
        WASM_UNREACHABLE("invalid node type");
    }
  }